

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpfaketransmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPFakeTransmitter::AddLoopbackAddress(RTPFakeTransmitter *this)

{
  reference puVar1;
  bool local_59;
  iterator local_48;
  _List_const_iterator<unsigned_int> local_40;
  iterator local_38;
  _List_const_iterator<unsigned_int> local_30;
  byte local_21;
  _List_const_iterator<unsigned_int> _Stack_20;
  bool found;
  const_iterator it;
  uint32_t loopbackaddr;
  RTPFakeTransmitter *this_local;
  
  it._M_node._4_4_ = 0x7f000001;
  std::_List_const_iterator<unsigned_int>::_List_const_iterator(&stack0xffffffffffffffe0);
  local_21 = 0;
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->localIPs);
  std::_List_const_iterator<unsigned_int>::_List_const_iterator(&local_30,&local_38);
  _Stack_20._M_node = local_30._M_node;
  while( true ) {
    local_59 = false;
    if ((local_21 & 1) == 0) {
      local_48._M_node =
           (_List_node_base *)
           std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->localIPs);
      std::_List_const_iterator<unsigned_int>::_List_const_iterator(&local_40,&local_48);
      local_59 = std::operator!=(&stack0xffffffffffffffe0,&local_40);
    }
    if (local_59 == false) break;
    puVar1 = std::_List_const_iterator<unsigned_int>::operator*(&stack0xffffffffffffffe0);
    if (*puVar1 == it._M_node._4_4_) {
      local_21 = 1;
    }
    std::_List_const_iterator<unsigned_int>::operator++(&stack0xffffffffffffffe0,0);
  }
  if ((local_21 & 1) == 0) {
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->localIPs,(value_type_conflict1 *)((long)&it._M_node + 4));
  }
  return;
}

Assistant:

void RTPFakeTransmitter::AddLoopbackAddress()
{
	uint32_t loopbackaddr = (((uint32_t)127)<<24)|((uint32_t)1);
	std::list<uint32_t>::const_iterator it;
	bool found = false;
	
	for (it = localIPs.begin() ; !found && it != localIPs.end() ; it++)
	{
		if (*it == loopbackaddr)
			found = true;
	}

	if (!found)
		localIPs.push_back(loopbackaddr);
}